

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

HelicsIterationResult
helicsFederateEnterExecutingModeIterative
          (HelicsFederate fed,HelicsIterationRequest iterate,HelicsError *err)

{
  IterationResult IVar1;
  Federate *this;
  IterationRequest iterate_00;
  HelicsIterationResult HVar2;
  
  this = getFed(fed,err);
  HVar2 = HELICS_ITERATION_RESULT_ERROR;
  if (this != (Federate *)0x0) {
    iterate_00 = (IterationRequest)(0x700030000020100 >> ((char)iterate * '\b' & 0x3fU));
    if (HELICS_ITERATION_REQUEST_ERROR < iterate) {
      iterate_00 = NO_ITERATIONS;
    }
    IVar1 = helics::Federate::enterExecutingMode(this,iterate_00);
    if (IVar1 < 4) {
      HVar2 = *(HelicsIterationResult *)(&DAT_004366d0 + (ulong)IVar1 * 4);
    }
  }
  return HVar2;
}

Assistant:

HelicsIterationResult helicsFederateEnterExecutingModeIterative(HelicsFederate fed, HelicsIterationRequest iterate, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_ITERATION_RESULT_ERROR;
    }
    try {
        auto val = fedObj->enterExecutingMode(getIterationRequest(iterate));
        return getIterationStatus(val);
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_ITERATION_RESULT_ERROR;
    }
}